

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkPrintFanio(FILE *pFile,Abc_Ntk_t *pNtk,int fUseFanio,int fUsePio,int fUseSupp,
                      int fUseCone)

{
  Vec_Int_t *vFan_00;
  Vec_Int_t *vFon_00;
  Vec_Int_t *vFanR_00;
  Vec_Int_t *vFonR_00;
  Vec_Int_t *vFonR;
  Vec_Int_t *vFanR;
  Vec_Int_t *vFon;
  Vec_Int_t *vFan;
  int fUseCone_local;
  int fUseSupp_local;
  int fUsePio_local;
  int fUseFanio_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  vFan_00 = Vec_IntAlloc(0);
  vFon_00 = Vec_IntAlloc(0);
  vFanR_00 = Vec_IntAlloc(0);
  vFonR_00 = Vec_IntAlloc(0);
  if (fUseFanio + fUsePio + fUseSupp + fUseCone != 1) {
    __assert_fail("fUseFanio + fUsePio + fUseSupp + fUseCone == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                  ,0x357,"void Abc_NtkPrintFanio(FILE *, Abc_Ntk_t *, int, int, int, int)");
  }
  if (fUseFanio == 0) {
    if (fUsePio == 0) {
      if (fUseSupp == 0) {
        if (fUseCone != 0) {
          Abc_NtkInOutConeCounters(pNtk,vFan_00,vFon_00,vFanR_00,vFonR_00);
          Abc_NtkPrintDistribInternal
                    (pFile,pNtk,"input cones","output cones","I/O","in-cone","out-cone",vFan_00,
                     vFon_00,vFanR_00,vFonR_00);
        }
      }
      else {
        Abc_NtkInOutSupportCounters(pNtk,vFan_00,vFon_00,vFanR_00,vFonR_00);
        Abc_NtkPrintDistribInternal
                  (pFile,pNtk,"input supports","output supports","I/O","in-supp","out-supp",vFan_00,
                   vFon_00,vFanR_00,vFonR_00);
      }
    }
    else {
      Abc_NtkInputOutputCounters(pNtk,vFan_00,vFon_00,vFanR_00,vFonR_00);
      Abc_NtkPrintDistribInternal
                (pFile,pNtk,"fanins","fanouts","I/O","fanin","fanout",vFan_00,vFon_00,vFanR_00,
                 vFonR_00);
    }
  }
  else {
    Abc_NtkFaninFanoutCounters(pNtk,vFan_00,vFon_00,vFanR_00,vFonR_00);
    Abc_NtkPrintDistribInternal
              (pFile,pNtk,"fanins","fanouts","Nodes","fanin","fanout",vFan_00,vFon_00,vFanR_00,
               vFonR_00);
  }
  Vec_IntFree(vFan_00);
  Vec_IntFree(vFon_00);
  Vec_IntFree(vFanR_00);
  Vec_IntFree(vFonR_00);
  return;
}

Assistant:

void Abc_NtkPrintFanio( FILE * pFile, Abc_Ntk_t * pNtk, int fUseFanio, int fUsePio, int fUseSupp, int fUseCone )
{
    Vec_Int_t * vFan = Vec_IntAlloc( 0 );
    Vec_Int_t * vFon = Vec_IntAlloc( 0 );
    Vec_Int_t * vFanR = Vec_IntAlloc( 0 );
    Vec_Int_t * vFonR = Vec_IntAlloc( 0 );
    assert( fUseFanio + fUsePio + fUseSupp + fUseCone == 1 );
    if ( fUseFanio )
    {
        Abc_NtkFaninFanoutCounters( pNtk, vFan, vFon, vFanR, vFonR );
        Abc_NtkPrintDistribInternal( pFile, pNtk, "fanins", "fanouts", "Nodes", "fanin", "fanout", vFan, vFon, vFanR, vFonR ); 
    }
    else if ( fUsePio )
    {
        Abc_NtkInputOutputCounters( pNtk, vFan, vFon, vFanR, vFonR );
        Abc_NtkPrintDistribInternal( pFile, pNtk, "fanins", "fanouts", "I/O", "fanin", "fanout", vFan, vFon, vFanR, vFonR ); 
    }
    else if ( fUseSupp )
    {
        Abc_NtkInOutSupportCounters( pNtk, vFan, vFon, vFanR, vFonR );
        Abc_NtkPrintDistribInternal( pFile, pNtk, "input supports", "output supports", "I/O", "in-supp", "out-supp", vFan, vFon, vFanR, vFonR ); 
    }
    else if ( fUseCone )
    {
        Abc_NtkInOutConeCounters( pNtk, vFan, vFon, vFanR, vFonR );
        Abc_NtkPrintDistribInternal( pFile, pNtk, "input cones", "output cones", "I/O", "in-cone", "out-cone", vFan, vFon, vFanR, vFonR ); 
    }
    Vec_IntFree( vFan );
    Vec_IntFree( vFon );
    Vec_IntFree( vFanR );
    Vec_IntFree( vFonR );
}